

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O0

void __thiscall Code_generator::visit(Code_generator *this,Inst_mrs *s)

{
  Register *pRVar1;
  allocator local_39;
  string local_38;
  Inst_mrs *local_18;
  Inst_mrs *s_local;
  Code_generator *this_local;
  
  local_18 = s;
  s_local = (Inst_mrs *)this;
  ast::Instruction::check_alignment(&s->super_Instruction);
  if ((local_18->rs->n != 0x12e) && (local_18->rs->n != 0x12f)) {
    pRVar1 = local_18->rs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Invalid register",&local_39);
    error_report(&pRVar1->location,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  ast::Sections::write16
            ((local_18->super_Instruction).super_Statement.section_index,
             (local_18->super_Instruction).super_Statement.section_offset,
             (ushort)(local_18->rs->n == 0x12f) << 4 | 0xb060 | (ushort)local_18->rd->n);
  return;
}

Assistant:

void Code_generator::visit(Inst_mrs *s)
{
	s->check_alignment();
	if (s->rs->n != CPSR && s->rs->n != SPSR)
		error_report(&s->rs->location, "Invalid register");
	Sections::write16(s->section_index, s->section_offset,
		static_cast<uint16_t>(MRS_OPCODE
			| ((s->rs->n == SPSR) << SPSR_INDICATION_POSITION)
			| (s->rd->n << RD_POSITION)));
}